

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkFile
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  Descriptor *pDVar1;
  FieldDescriptor *pFVar2;
  ServiceDescriptor *pSVar3;
  int iVar4;
  DescriptorProto *proto_00;
  FieldDescriptorProto *proto_01;
  ServiceDescriptorProto *proto_02;
  int local_2c;
  int local_28;
  int i_2;
  int i_1;
  int i;
  FileDescriptorProto *proto_local;
  FileDescriptor *file_local;
  DescriptorBuilder *this_local;
  
  i_2 = 0;
  while( true ) {
    iVar4 = FileDescriptor::message_type_count(file);
    if (iVar4 <= i_2) break;
    pDVar1 = file->message_types_;
    proto_00 = FileDescriptorProto::message_type(proto,i_2);
    CrossLinkMessage(this,pDVar1 + i_2,proto_00);
    i_2 = i_2 + 1;
  }
  local_28 = 0;
  while( true ) {
    iVar4 = FileDescriptor::extension_count(file);
    if (iVar4 <= local_28) break;
    pFVar2 = file->extensions_;
    proto_01 = FileDescriptorProto::extension(proto,local_28);
    CrossLinkField(this,pFVar2 + local_28,proto_01);
    local_28 = local_28 + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar4 = FileDescriptor::service_count(file);
    if (iVar4 <= local_2c) break;
    pSVar3 = file->services_;
    proto_02 = FileDescriptorProto::service(proto,local_2c);
    CrossLinkService(this,pSVar3 + local_2c,proto_02);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkFile(FileDescriptor* file,
                                      const FileDescriptorProto& proto) {
  for (int i = 0; i < file->message_type_count(); i++) {
    CrossLinkMessage(&file->message_types_[i], proto.message_type(i));
  }

  for (int i = 0; i < file->extension_count(); i++) {
    CrossLinkField(&file->extensions_[i], proto.extension(i));
  }

  for (int i = 0; i < file->service_count(); i++) {
    CrossLinkService(&file->services_[i], proto.service(i));
  }
}